

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void uncounting_illegal_callback_fn(char *str,void *data)

{
  int32_t *p;
  
  *(int *)data = *data + -1;
  return;
}

Assistant:

static void uncounting_illegal_callback_fn(const char* str, void* data) {
    /* Dummy callback function that just counts (backwards). */
    int32_t *p;
    (void)str;
    p = data;
    CHECK(*p != INT32_MIN);
    (*p)--;
}